

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_uint64 ma_dr_wav_read_pcm_frames_f32be(ma_dr_wav *pWav,ma_uint64 framesToRead,float *pBufferOut)

{
  ushort uVar1;
  float fVar2;
  ma_uint64 mVar3;
  long lVar4;
  
  mVar3 = ma_dr_wav_read_pcm_frames_f32(pWav,framesToRead,pBufferOut);
  if (pBufferOut != (float *)0x0) {
    uVar1 = pWav->channels;
    for (lVar4 = 0; mVar3 * uVar1 - lVar4 != 0; lVar4 = lVar4 + 1) {
      fVar2 = pBufferOut[lVar4];
      pBufferOut[lVar4] =
           (float)((uint)fVar2 >> 0x18 | ((uint)fVar2 & 0xff0000) >> 8 | ((uint)fVar2 & 0xff00) << 8
                  | (int)fVar2 << 0x18);
    }
  }
  return mVar3;
}

Assistant:

MA_API ma_uint64 ma_dr_wav_read_pcm_frames_f32be(ma_dr_wav* pWav, ma_uint64 framesToRead, float* pBufferOut)
{
    ma_uint64 framesRead = ma_dr_wav_read_pcm_frames_f32(pWav, framesToRead, pBufferOut);
    if (pBufferOut != NULL && ma_dr_wav__is_little_endian() == MA_TRUE) {
        ma_dr_wav__bswap_samples_f32(pBufferOut, framesRead*pWav->channels);
    }
    return framesRead;
}